

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O0

void read_vui_parameters(sps_t *sps,bs_t *b)

{
  uint32_t uVar1;
  bs_t *b_local;
  sps_t *sps_local;
  
  uVar1 = bs_read_u1(b);
  (sps->vui).aspect_ratio_info_present_flag = uVar1;
  if ((sps->vui).aspect_ratio_info_present_flag != 0) {
    uVar1 = bs_read_u8(b);
    (sps->vui).aspect_ratio_idc = uVar1;
    if ((sps->vui).aspect_ratio_idc == 0xff) {
      uVar1 = bs_read_u(b,0x10);
      (sps->vui).sar_width = uVar1;
      uVar1 = bs_read_u(b,0x10);
      (sps->vui).sar_height = uVar1;
    }
  }
  uVar1 = bs_read_u1(b);
  (sps->vui).overscan_info_present_flag = uVar1;
  if ((sps->vui).overscan_info_present_flag != 0) {
    uVar1 = bs_read_u1(b);
    (sps->vui).overscan_appropriate_flag = uVar1;
  }
  uVar1 = bs_read_u1(b);
  (sps->vui).video_signal_type_present_flag = uVar1;
  if ((sps->vui).video_signal_type_present_flag != 0) {
    uVar1 = bs_read_u(b,3);
    (sps->vui).video_format = uVar1;
    uVar1 = bs_read_u1(b);
    (sps->vui).video_full_range_flag = uVar1;
    uVar1 = bs_read_u1(b);
    (sps->vui).colour_description_present_flag = uVar1;
    if ((sps->vui).colour_description_present_flag != 0) {
      uVar1 = bs_read_u8(b);
      (sps->vui).colour_primaries = uVar1;
      uVar1 = bs_read_u8(b);
      (sps->vui).transfer_characteristics = uVar1;
      uVar1 = bs_read_u8(b);
      (sps->vui).matrix_coefficients = uVar1;
    }
  }
  uVar1 = bs_read_u1(b);
  (sps->vui).chroma_loc_info_present_flag = uVar1;
  if ((sps->vui).chroma_loc_info_present_flag != 0) {
    uVar1 = bs_read_ue(b);
    (sps->vui).chroma_sample_loc_type_top_field = uVar1;
    uVar1 = bs_read_ue(b);
    (sps->vui).chroma_sample_loc_type_bottom_field = uVar1;
  }
  uVar1 = bs_read_u1(b);
  (sps->vui).timing_info_present_flag = uVar1;
  if ((sps->vui).timing_info_present_flag != 0) {
    uVar1 = bs_read_u(b,0x20);
    (sps->vui).num_units_in_tick = uVar1;
    uVar1 = bs_read_u(b,0x20);
    (sps->vui).time_scale = uVar1;
    uVar1 = bs_read_u1(b);
    (sps->vui).fixed_frame_rate_flag = uVar1;
  }
  uVar1 = bs_read_u1(b);
  (sps->vui).nal_hrd_parameters_present_flag = uVar1;
  if ((sps->vui).nal_hrd_parameters_present_flag != 0) {
    read_hrd_parameters(&sps->hrd_nal,b);
  }
  uVar1 = bs_read_u1(b);
  (sps->vui).vcl_hrd_parameters_present_flag = uVar1;
  if ((sps->vui).vcl_hrd_parameters_present_flag != 0) {
    read_hrd_parameters(&sps->hrd_vcl,b);
  }
  if (((sps->vui).nal_hrd_parameters_present_flag != 0) ||
     ((sps->vui).vcl_hrd_parameters_present_flag != 0)) {
    uVar1 = bs_read_u1(b);
    (sps->vui).low_delay_hrd_flag = uVar1;
  }
  uVar1 = bs_read_u1(b);
  (sps->vui).pic_struct_present_flag = uVar1;
  uVar1 = bs_read_u1(b);
  (sps->vui).bitstream_restriction_flag = uVar1;
  if ((sps->vui).bitstream_restriction_flag != 0) {
    uVar1 = bs_read_u1(b);
    (sps->vui).motion_vectors_over_pic_boundaries_flag = uVar1;
    uVar1 = bs_read_ue(b);
    (sps->vui).max_bytes_per_pic_denom = uVar1;
    uVar1 = bs_read_ue(b);
    (sps->vui).max_bits_per_mb_denom = uVar1;
    uVar1 = bs_read_ue(b);
    (sps->vui).log2_max_mv_length_horizontal = uVar1;
    uVar1 = bs_read_ue(b);
    (sps->vui).log2_max_mv_length_vertical = uVar1;
    uVar1 = bs_read_ue(b);
    (sps->vui).num_reorder_frames = uVar1;
    uVar1 = bs_read_ue(b);
    (sps->vui).max_dec_frame_buffering = uVar1;
  }
  return;
}

Assistant:

void read_vui_parameters(sps_t* sps, bs_t* b)
{
    sps->vui.aspect_ratio_info_present_flag = bs_read_u1(b);
    if( sps->vui.aspect_ratio_info_present_flag )
    {
        sps->vui.aspect_ratio_idc = bs_read_u8(b);
        if( sps->vui.aspect_ratio_idc == SAR_Extended )
        {
            sps->vui.sar_width = bs_read_u(b, 16);
            sps->vui.sar_height = bs_read_u(b, 16);
        }
    }
    sps->vui.overscan_info_present_flag = bs_read_u1(b);
    if( sps->vui.overscan_info_present_flag )
    {
        sps->vui.overscan_appropriate_flag = bs_read_u1(b);
    }
    sps->vui.video_signal_type_present_flag = bs_read_u1(b);
    if( sps->vui.video_signal_type_present_flag )
    {
        sps->vui.video_format = bs_read_u(b, 3);
        sps->vui.video_full_range_flag = bs_read_u1(b);
        sps->vui.colour_description_present_flag = bs_read_u1(b);
        if( sps->vui.colour_description_present_flag )
        {
            sps->vui.colour_primaries = bs_read_u8(b);
            sps->vui.transfer_characteristics = bs_read_u8(b);
            sps->vui.matrix_coefficients = bs_read_u8(b);
        }
    }
    sps->vui.chroma_loc_info_present_flag = bs_read_u1(b);
    if( sps->vui.chroma_loc_info_present_flag )
    {
        sps->vui.chroma_sample_loc_type_top_field = bs_read_ue(b);
        sps->vui.chroma_sample_loc_type_bottom_field = bs_read_ue(b);
    }
    sps->vui.timing_info_present_flag = bs_read_u1(b);
    if( sps->vui.timing_info_present_flag )
    {
        sps->vui.num_units_in_tick = bs_read_u(b, 32);
        sps->vui.time_scale = bs_read_u(b, 32);
        sps->vui.fixed_frame_rate_flag = bs_read_u1(b);
    }
    sps->vui.nal_hrd_parameters_present_flag = bs_read_u1(b);
    if( sps->vui.nal_hrd_parameters_present_flag )
    {
        read_hrd_parameters(&sps->hrd_nal, b);
    }
    sps->vui.vcl_hrd_parameters_present_flag = bs_read_u1(b);
    if( sps->vui.vcl_hrd_parameters_present_flag )
    {
        read_hrd_parameters(&sps->hrd_vcl, b);
    }
    if( sps->vui.nal_hrd_parameters_present_flag || sps->vui.vcl_hrd_parameters_present_flag )
    {
        sps->vui.low_delay_hrd_flag = bs_read_u1(b);
    }
    sps->vui.pic_struct_present_flag = bs_read_u1(b);
    sps->vui.bitstream_restriction_flag = bs_read_u1(b);
    if( sps->vui.bitstream_restriction_flag )
    {
        sps->vui.motion_vectors_over_pic_boundaries_flag = bs_read_u1(b);
        sps->vui.max_bytes_per_pic_denom = bs_read_ue(b);
        sps->vui.max_bits_per_mb_denom = bs_read_ue(b);
        sps->vui.log2_max_mv_length_horizontal = bs_read_ue(b);
        sps->vui.log2_max_mv_length_vertical = bs_read_ue(b);
        sps->vui.num_reorder_frames = bs_read_ue(b);
        sps->vui.max_dec_frame_buffering = bs_read_ue(b);
    }
}